

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gaussian_mixture_modeling.cc
# Opt level: O3

bool __thiscall
sptk::GaussianMixtureModeling::Initialize
          (GaussianMixtureModeling *this,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *input_vectors,vector<double,_std::allocator<double>_> *weights,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *mean_vectors,
          vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_> *covariance_matrices
          )

{
  SymmetricMatrix *pSVar1;
  int *piVar2;
  double dVar3;
  int iVar4;
  vector<double,_std::allocator<double>_> *pvVar5;
  pointer pvVar6;
  pointer pvVar7;
  pointer pdVar8;
  bool bVar9;
  double *pdVar10;
  ulong uVar11;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *pvVar12;
  int iVar13;
  vector<double,_std::allocator<double>_> *vector;
  vector<double,_std::allocator<double>_> *data;
  GaussianMixtureModeling *this_00;
  ulong uVar14;
  long lVar15;
  int iVar16;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *__range2;
  long lVar17;
  uint uVar18;
  ulong uVar19;
  ulong uVar20;
  vector<double,_std::allocator<double>_> mean;
  vector<int,_std::allocator<int>_> codebook_indices;
  vector<int,_std::allocator<int>_> num_data_in_cluster;
  long local_150;
  Row local_148;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *local_130;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *local_128;
  GaussianMixtureModeling *local_120;
  vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_> *local_118;
  long local_110;
  StatisticsAccumulation local_108;
  ulong local_f0;
  ulong local_e8;
  double local_e0;
  double local_d8;
  LindeBuzoGrayAlgorithm local_d0;
  
  local_128 = mean_vectors;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::clear(mean_vectors);
  local_120 = this;
  StatisticsAccumulation::StatisticsAccumulation(&local_108,this->num_order_,1,false,false);
  StatisticsAccumulation::Buffer::Buffer((Buffer *)&local_d0);
  data = (input_vectors->
         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
         )._M_impl.super__Vector_impl_data._M_start;
  pvVar5 = (input_vectors->
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (data != pvVar5) {
    do {
      bVar9 = StatisticsAccumulation::Run(&local_108,data,(Buffer *)&local_d0);
      if (!bVar9) {
        StatisticsAccumulation::Buffer::~Buffer((Buffer *)&local_d0);
        return false;
      }
      data = data + 1;
    } while (data != pvVar5);
  }
  local_148._vptr_Row = (_func_int **)0x0;
  local_148.matrix_ = (pointer)0x0;
  local_148.row_ = 0;
  local_148._20_4_ = 0;
  bVar9 = StatisticsAccumulation::GetMean
                    (&local_108,(Buffer *)&local_d0,
                     (vector<double,_std::allocator<double>_> *)&local_148);
  if (bVar9) {
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::push_back(local_128,(value_type *)&local_148);
  }
  if (local_148._vptr_Row != (_func_int **)0x0) {
    operator_delete(local_148._vptr_Row);
  }
  StatisticsAccumulation::Buffer::~Buffer((Buffer *)&local_d0);
  if (!bVar9) {
    return false;
  }
  local_d0._vptr_LindeBuzoGrayAlgorithm._0_4_ = 0;
  local_130 = input_vectors;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_108,
             ((long)(input_vectors->
                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(input_vectors->
                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555,
             (value_type_conflict2 *)&local_d0,(allocator_type *)&local_148);
  this_00 = local_120;
  iVar13 = local_120->num_mixture_;
  if (1 < iVar13) {
    LindeBuzoGrayAlgorithm::LindeBuzoGrayAlgorithm
              (&local_d0,local_120->num_order_,1,iVar13,1,1000,1e-05,1e-05,1);
    bVar9 = LindeBuzoGrayAlgorithm::Run
                      (&local_d0,local_130,local_128,(vector<int,_std::allocator<int>_> *)&local_108
                       ,(double *)&local_148);
    if (!bVar9) {
      bVar9 = false;
      goto LAB_00107522;
    }
    iVar13 = this_00->num_mixture_;
  }
  pvVar6 = (local_130->
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  pvVar7 = (local_130->
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_d0,(long)iVar13,
             (allocator_type *)&local_148);
  uVar18 = (int)((long)pvVar6 - (long)pvVar7 >> 3) * -0x55555555;
  if (0 < (int)uVar18) {
    uVar14 = 0;
    do {
      piVar2 = (int *)(CONCAT44(local_d0._vptr_LindeBuzoGrayAlgorithm._4_4_,
                                local_d0._vptr_LindeBuzoGrayAlgorithm._0_4_) +
                      (long)*(int *)((long)local_108._vptr_StatisticsAccumulation + uVar14 * 4) * 4)
      ;
      *piVar2 = *piVar2 + 1;
      uVar14 = uVar14 + 1;
    } while ((uVar18 & 0x7fffffff) != uVar14);
  }
  std::vector<double,_std::allocator<double>_>::resize(weights,(long)this_00->num_mixture_);
  pvVar12 = local_130;
  iVar13 = this_00->num_mixture_;
  if (0 < (long)iVar13) {
    pdVar8 = (weights->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar15 = 0;
    do {
      pdVar8[lVar15] =
           (double)*(int *)(CONCAT44(local_d0._vptr_LindeBuzoGrayAlgorithm._4_4_,
                                     local_d0._vptr_LindeBuzoGrayAlgorithm._0_4_) + lVar15 * 4) /
           (double)(int)uVar18;
      lVar15 = lVar15 + 1;
    } while (iVar13 != lVar15);
  }
  FloorWeight(this_00,weights);
  std::vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>::resize
            (covariance_matrices,(long)this_00->num_mixture_);
  uVar14 = (ulong)(uint)this_00->num_mixture_;
  if (0 < this_00->num_mixture_) {
    lVar15 = 0;
    lVar17 = 0;
    do {
      SymmetricMatrix::Resize
                ((SymmetricMatrix *)
                 ((long)&((covariance_matrices->
                          super__Vector_base<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>
                          )._M_impl.super__Vector_impl_data._M_start)->_vptr_SymmetricMatrix +
                 lVar15),this_00->num_order_ + 1);
      SymmetricMatrix::Fill
                ((SymmetricMatrix *)
                 ((long)&((covariance_matrices->
                          super__Vector_base<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>
                          )._M_impl.super__Vector_impl_data._M_start)->_vptr_SymmetricMatrix +
                 lVar15),0.0);
      lVar17 = lVar17 + 1;
      uVar14 = (ulong)this_00->num_mixture_;
      lVar15 = lVar15 + 0x40;
      pvVar12 = local_130;
    } while (lVar17 < (long)uVar14);
  }
  local_118 = covariance_matrices;
  if (0 < (int)uVar18) {
    pSVar1 = &this_00->mask_;
    uVar19 = (ulong)(uVar18 & 0x7fffffff);
    uVar11 = (ulong)(uint)this_00->num_order_;
    uVar14 = 0;
    local_f0 = uVar19;
    do {
      if (-1 < (int)uVar11) {
        local_110 = *(long *)&(pvVar12->
                              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start[uVar14].
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data;
        iVar13 = *(int *)((long)local_108._vptr_StatisticsAccumulation + uVar14 * 4);
        lVar15 = *(long *)&(local_128->
                           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start[iVar13].
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data;
        uVar20 = 0;
        local_e8 = uVar14;
        do {
          local_e0 = *(double *)(local_110 + uVar20 * 8) - *(double *)(lVar15 + uVar20 * 8);
          uVar14 = uVar20 & 0xffffffff;
          if (this_00->is_diagonal_ == false) {
            uVar14 = 0;
          }
          do {
            local_148._vptr_Row = (_func_int **)&PTR__Row_00117bb0;
            local_148.matrix_ = pSVar1;
            local_148.row_ = (int)uVar20;
            pdVar10 = SymmetricMatrix::Row::operator[](&local_148,(int)uVar14);
            if ((*pdVar10 != 0.0) || (NAN(*pdVar10))) {
              dVar3 = *(double *)(local_110 + uVar14 * 8);
              local_d8 = *(double *)(lVar15 + uVar14 * 8);
              local_148.matrix_ =
                   (local_118->
                   super__Vector_base<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>
                   )._M_impl.super__Vector_impl_data._M_start + iVar13;
              local_148._vptr_Row = (_func_int **)&PTR__Row_00117bb0;
              local_148.row_ = (int)uVar20;
              pdVar10 = SymmetricMatrix::Row::operator[](&local_148,(int)uVar14);
              *pdVar10 = (dVar3 - local_d8) * local_e0 + *pdVar10;
            }
            uVar14 = uVar14 + 1;
          } while (uVar20 + 1 != uVar14);
          uVar11 = (ulong)local_120->num_order_;
          bVar9 = (long)uVar20 < (long)uVar11;
          uVar14 = local_e8;
          pvVar12 = local_130;
          this_00 = local_120;
          uVar19 = local_f0;
          uVar20 = uVar20 + 1;
        } while (bVar9);
      }
      uVar14 = uVar14 + 1;
    } while (uVar14 != uVar19);
    uVar14 = (ulong)(uint)this_00->num_mixture_;
  }
  if (0 < (int)uVar14) {
    pSVar1 = &this_00->mask_;
    iVar13 = this_00->num_order_;
    local_150 = 0;
    do {
      if (-1 < iVar13) {
        iVar16 = 0;
        do {
          iVar13 = 0;
          if (this_00->is_diagonal_ != false) {
            iVar13 = iVar16;
          }
          do {
            local_148._vptr_Row = (_func_int **)&PTR__Row_00117bb0;
            local_148.matrix_ = pSVar1;
            local_148.row_ = iVar16;
            pdVar10 = SymmetricMatrix::Row::operator[](&local_148,iVar13);
            if ((*pdVar10 != 0.0) || (NAN(*pdVar10))) {
              iVar4 = *(int *)(CONCAT44(local_d0._vptr_LindeBuzoGrayAlgorithm._4_4_,
                                        local_d0._vptr_LindeBuzoGrayAlgorithm._0_4_) + local_150 * 4
                              );
              local_148.matrix_ =
                   (local_118->
                   super__Vector_base<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>
                   )._M_impl.super__Vector_impl_data._M_start + local_150;
              local_148._vptr_Row = (_func_int **)&PTR__Row_00117bb0;
              local_148.row_ = iVar16;
              pdVar10 = SymmetricMatrix::Row::operator[](&local_148,iVar13);
              *pdVar10 = *pdVar10 / (double)iVar4;
            }
            iVar13 = iVar13 + 1;
          } while (iVar16 + 1 != iVar13);
          iVar13 = local_120->num_order_;
          bVar9 = iVar16 < iVar13;
          this_00 = local_120;
          iVar16 = iVar16 + 1;
        } while (bVar9);
        uVar14 = (ulong)(uint)local_120->num_mixture_;
      }
      local_150 = local_150 + 1;
    } while (local_150 < (int)uVar14);
  }
  FloorVariance(this_00,local_118);
  if ((void *)CONCAT44(local_d0._vptr_LindeBuzoGrayAlgorithm._4_4_,
                       local_d0._vptr_LindeBuzoGrayAlgorithm._0_4_) != (void *)0x0) {
    operator_delete((void *)CONCAT44(local_d0._vptr_LindeBuzoGrayAlgorithm._4_4_,
                                     local_d0._vptr_LindeBuzoGrayAlgorithm._0_4_));
  }
  bVar9 = true;
LAB_00107522:
  if (local_108._vptr_StatisticsAccumulation != (_func_int **)0x0) {
    operator_delete(local_108._vptr_StatisticsAccumulation);
  }
  return bVar9;
}

Assistant:

bool GaussianMixtureModeling::Initialize(
    const std::vector<std::vector<double> >& input_vectors,
    std::vector<double>* weights,
    std::vector<std::vector<double> >* mean_vectors,
    std::vector<SymmetricMatrix>* covariance_matrices) const {
  // Initialize codebook.
  {
    mean_vectors->clear();
    StatisticsAccumulation statistics_accumulation(num_order_, 1);
    StatisticsAccumulation::Buffer buffer;

    for (const std::vector<double>& vector : input_vectors) {
      if (!statistics_accumulation.Run(vector, &buffer)) {
        return false;
      }
    }

    std::vector<double> mean;
    if (!statistics_accumulation.GetMean(buffer, &mean)) {
      return false;
    }
    mean_vectors->push_back(mean);
  }

  // Initialize mean vectors.
  std::vector<int> codebook_indices(input_vectors.size(), 0);
  if (2 <= num_mixture_) {
    const int num_iteration(1000);
    const double convergence_threshold(1e-5);
    const double splitting_factor(1e-5);
    const int seed(1);
    double distance;
    LindeBuzoGrayAlgorithm lbg(num_order_, 1, num_mixture_, 1, num_iteration,
                               convergence_threshold, splitting_factor, seed);
    if (!lbg.Run(input_vectors, mean_vectors, &codebook_indices, &distance)) {
      return false;
    }
  }

  // Count number of data for each cluster.
  const int num_data(static_cast<int>(input_vectors.size()));
  std::vector<int> num_data_in_cluster(num_mixture_);
  {
    const int* src(&(codebook_indices[0]));
    int* dst(&(num_data_in_cluster[0]));
    for (int t(0); t < num_data; ++t) {
      ++dst[src[t]];
    }
  }

  // Initialize weights.
  {
    weights->resize(num_mixture_);
    for (int k(0); k < num_mixture_; ++k) {
      (*weights)[k] = static_cast<double>(num_data_in_cluster[k]) / num_data;
    }
    FloorWeight(weights);
  }

  // Initialize covariances.
  {
    covariance_matrices->resize(num_mixture_);
    for (int k(0); k < num_mixture_; ++k) {
      (*covariance_matrices)[k].Resize(num_order_ + 1);
      (*covariance_matrices)[k].Fill(0.0);
    }

    for (int t(0); t < num_data; ++t) {
      const double* x(&(input_vectors[t][0]));
      const int k(codebook_indices[t]);
      const double* mu(&((*mean_vectors)[k][0]));
      for (int l(0); l <= num_order_; ++l) {
        const double diff1(x[l] - mu[l]);
        for (int m(is_diagonal_ ? l : 0); m <= l; ++m) {
          if (0.0 != mask_[l][m]) {
            const double diff2(x[m] - mu[m]);
            (*covariance_matrices)[k][l][m] += diff1 * diff2;
          }
        }
      }
    }

    for (int k(0); k < num_mixture_; ++k) {
      for (int l(0); l <= num_order_; ++l) {
        for (int m(is_diagonal_ ? l : 0); m <= l; ++m) {
          if (0.0 != mask_[l][m]) {
            (*covariance_matrices)[k][l][m] /= num_data_in_cluster[k];
          }
        }
      }
    }
    FloorVariance(covariance_matrices);
  }

  return true;
}